

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Gridded_Data_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Gridded_Data_PDU *this)

{
  pointer pKVar1;
  pointer pKVar2;
  ostream *poVar3;
  KINT32 Value;
  KINT32 Value_00;
  pointer pKVar4;
  pointer pKVar5;
  KStringStream ss;
  KString KStack_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&KStack_278,&this->super_Header);
  poVar3 = std::operator<<(local_1a8,(string *)&KStack_278);
  poVar3 = std::operator<<(poVar3,"-Gridded Data PDU-\n");
  poVar3 = std::operator<<(poVar3,"Environmental Process ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_EnvProcID);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"Field Number: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_ui16FieldNum);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"PDU Number: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_ui16PDUNum);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"PDU Total: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_ui16PDUTotal);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Coordinate System: ");
  DATA_TYPE::ENUMS::GetEnumAsStringCoordinateSystem_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui16CordSys,Value);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Number Of Axis: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumAxis);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Constant Grid: ");
  DATA_TYPE::ENUMS::GetEnumAsStringConstantGrid_abi_cxx11_
            (&local_218,(ENUMS *)(ulong)this->m_ui8ConstGrid,Value_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Environment Type: ");
  DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_(&local_238,&this->m_EnvType);
  poVar3 = std::operator<<(poVar3,(string *)&local_238);
  poVar3 = std::operator<<(poVar3,"Orientation: ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_258,&this->m_Ori);
  poVar3 = std::operator<<(poVar3,(string *)&local_258);
  poVar3 = std::operator<<(poVar3,"Sample Time: ");
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Total Values: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Vector Dimension: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8VecDim);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&KStack_278);
  pKVar1 = (this->m_vpGridAxisDesc).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar5 = (this->m_vpGridAxisDesc).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar5 != pKVar1; pKVar5 = pKVar5 + 1) {
    (*(pKVar5->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_278);
    std::operator<<(local_1a8,(string *)&KStack_278);
    std::__cxx11::string::~string((string *)&KStack_278);
  }
  pKVar2 = (this->m_vGridData).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vGridData).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_278);
    std::operator<<(local_1a8,(string *)&KStack_278);
    std::__cxx11::string::~string((string *)&KStack_278);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Gridded_Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Gridded Data PDU-\n"
       << "Environmental Process ID:\n"
       << m_EnvProcID.GetAsString()
       << "Field Number: "      << m_ui16FieldNum                                   << "\n"
       << "PDU Number: "        << m_ui16PDUNum                                     << "\n"
       << "PDU Total: "         << m_ui16PDUTotal                                   << "\n"
       << "Coordinate System: " << GetEnumAsStringCoordinateSystem( m_ui16CordSys ) << "\n"
       << "Number Of Axis: "    <<  ( KUINT16 )m_ui8NumAxis                         << "\n"
       << "Constant Grid: "     << GetEnumAsStringConstantGrid( m_ui8ConstGrid )    << "\n"
       << "Environment Type: "  << m_EnvType.GetAsString()
       << "Orientation: "       << m_Ori.GetAsString()
       << "Sample Time: "       << m_ui64SampleTime                                 << "\n"
       << "Total Values: "      << m_ui32TotalValues                                << "\n"
       << "Vector Dimension: "  << ( KUINT16 )m_ui8VecDim                           << "\n";

    vector<GridAxisDescriptor>::const_iterator citrAxis = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrAxisEnd = m_vpGridAxisDesc.end();
    for( ; citrAxis != citrAxisEnd; ++citrAxis )
    {
        ss << ( *citrAxis )->GetAsString();
    }

    vector<GridDataPtr>::const_iterator citrData = m_vGridData.begin();
    vector<GridDataPtr>::const_iterator citrDataEnd = m_vGridData.end();
    for( ; citrData != citrDataEnd; ++citrData )
    {
        ss << ( *citrData )->GetAsString();
    }

    return ss.str();
}